

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void sgai_set_diagonal_block
               (Integer g_a,void *ptr,Integer g_v,Integer *loA,Integer *hiA,Integer ld,Integer type)

{
  void *__ptr;
  long *in_RCX;
  long in_RSI;
  Integer in_RDI;
  long *in_R8;
  long in_R9;
  Integer in_stack_00000008;
  SingleComplex *fca;
  DoubleComplex *dca;
  long *la;
  double *da;
  float *fa;
  int *ia;
  void *buf;
  Integer i;
  Integer hi [2];
  Integer lo [2];
  Integer *in_stack_000000a0;
  Integer jhiA;
  Integer jloA;
  Integer ihiA;
  Integer iloA;
  Integer vhi;
  Integer vlo;
  Integer size;
  Integer nelem;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  undefined4 *local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined4 *local_b8;
  undefined4 *local_b0;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  Integer local_40;
  long local_38;
  long local_30;
  long local_10;
  Integer local_8;
  
  local_58 = *in_RCX;
  local_60 = *in_R8;
  local_68 = in_RCX[1];
  local_70 = in_R8[1];
  if (0 < local_58) {
    local_e0 = local_68;
    if (local_68 <= local_58) {
      local_e0 = local_58;
    }
    local_88 = local_e0;
    local_e8 = local_68;
    if (local_68 <= local_58) {
      local_e8 = local_58;
    }
    local_80 = local_e8;
    local_f0 = local_70;
    if (local_60 <= local_70) {
      local_f0 = local_60;
    }
    local_98 = local_f0;
    local_f8 = local_70;
    if (local_60 <= local_70) {
      local_f8 = local_60;
    }
    local_90 = local_f8;
    if (local_e0 <= local_f0) {
      local_30 = in_R9;
      local_10 = in_RSI;
      local_8 = in_RDI;
      local_40 = GAsizeof(in_stack_00000008);
      if (local_58 < local_68) {
        local_100 = local_68;
      }
      else {
        local_100 = local_58;
      }
      local_48 = local_100;
      if (local_70 < local_60) {
        local_108 = local_70;
      }
      else {
        local_108 = local_60;
      }
      local_50 = local_108;
      local_38 = (local_108 - local_100) + 1;
      __ptr = malloc(local_38 * local_40);
      if (__ptr == (void *)0x0) {
        pnga_error((char *)lo[0],hi[1]);
      }
      pnga_get(iloA,(Integer *)ihiA,(Integer *)jloA,(void *)jhiA,in_stack_000000a0);
      switch(in_stack_00000008) {
      case 0x3e9:
        local_b0 = (undefined4 *)
                   (((local_30 * (local_80 - local_68) + local_88) - local_58) * 4 + local_10);
        for (local_a0 = 0; local_a0 < (local_98 - local_88) + 1; local_a0 = local_a0 + 1) {
          *local_b0 = *(undefined4 *)((long)__ptr + local_a0 * 4);
          local_b0 = local_b0 + local_30 + 1;
        }
        break;
      case 0x3ea:
        local_c8 = (undefined8 *)
                   (((local_30 * (local_80 - local_68) + local_88) - local_58) * 8 + local_10);
        for (local_a0 = 0; local_a0 < (local_98 - local_88) + 1; local_a0 = local_a0 + 1) {
          *local_c8 = *(undefined8 *)((long)__ptr + local_a0 * 8);
          local_c8 = local_c8 + local_30 + 1;
        }
        break;
      case 0x3eb:
        local_b8 = (undefined4 *)
                   (((local_30 * (local_80 - local_68) + local_88) - local_58) * 4 + local_10);
        for (local_a0 = 0; local_a0 < (local_98 - local_88) + 1; local_a0 = local_a0 + 1) {
          *local_b8 = *(undefined4 *)((long)__ptr + local_a0 * 4);
          local_b8 = local_b8 + local_30 + 1;
        }
        break;
      case 0x3ec:
        local_c0 = (undefined8 *)
                   (((local_30 * (local_80 - local_68) + local_88) - local_58) * 8 + local_10);
        for (local_a0 = 0; local_a0 < (local_98 - local_88) + 1; local_a0 = local_a0 + 1) {
          *local_c0 = *(undefined8 *)((long)__ptr + local_a0 * 8);
          local_c0 = local_c0 + local_30 + 1;
        }
        break;
      default:
        pnga_error((char *)lo[0],hi[1]);
        break;
      case 0x3ee:
        local_d8 = (undefined4 *)
                   (((local_30 * (local_80 - local_68) + local_88) - local_58) * 8 + local_10);
        for (local_a0 = 0; local_a0 < (local_98 - local_88) + 1; local_a0 = local_a0 + 1) {
          *local_d8 = *(undefined4 *)((long)__ptr + local_a0 * 8);
          local_d8[1] = *(undefined4 *)((long)__ptr + local_a0 * 8 + 4);
          local_d8 = local_d8 + (local_30 + 1) * 2;
        }
        break;
      case 0x3ef:
        local_d0 = (undefined8 *)
                   (((local_30 * (local_80 - local_68) + local_88) - local_58) * 0x10 + local_10);
        for (local_a0 = 0; local_a0 < (local_98 - local_88) + 1; local_a0 = local_a0 + 1) {
          *local_d0 = *(undefined8 *)((long)__ptr + local_a0 * 0x10);
          local_d0[1] = *(undefined8 *)((long)__ptr + local_a0 * 0x10 + 8);
          local_d0 = local_d0 + (local_30 + 1) * 2;
        }
      }
      free(__ptr);
      local_88 = local_58;
      local_80 = local_68;
      local_98 = local_60;
      local_90 = local_70;
      pnga_release_update(local_8,&local_88,&local_98);
    }
  }
  return;
}

Assistant:

static void sgai_set_diagonal_block(Integer g_a, void *ptr, Integer g_v, Integer *loA,
                            Integer *hiA, Integer ld, Integer type)
{
  Integer nelem, size;
  Integer vlo, vhi, iloA, ihiA, jloA, jhiA, lo[2], hi[2];
  Integer i;
  void *buf;
  int *ia;
  float *fa;
  double *da;
  long *la;
  DoubleComplex *dca;
  SingleComplex *fca;

  iloA = loA[0];
  ihiA = hiA[0];
  jloA = loA[1];
  jhiA = hiA[1];

  /* determine subset of my patch to access */
  if (iloA > 0)
  {
    lo[0] = GA_MAX (iloA, jloA);
    lo[1] = GA_MAX (iloA, jloA);
    hi[0] = GA_MIN (ihiA, jhiA);
    hi[1] = GA_MIN (ihiA, jhiA);



    if (hi[0] >= lo[0]) /*make sure the equality symbol is there!!! */
    {                   /* we got a block containing diagonal elements*/

      /*allocate a buffer for the given vector g_v */
      size = GAsizeof (type);
      vlo = GA_MAX (iloA, jloA);
      vhi = GA_MIN (ihiA, jhiA);
      nelem = vhi - vlo + 1;
      buf = malloc (nelem * size);
      if (buf == NULL)
        pnga_error
          ("ga_set_diagonal_:failed to allocate memory for local buffer",0);

      /* get the vector from the global array to the local memory buffer */
      pnga_get (g_v, &vlo, &vhi, buf, &vhi);

      switch (type)
      {
        case C_INT:
          ia = (int *) ptr;
          ia += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            *ia = ((int *) buf)[i];
            ia += ld + 1;
          }
          break;
        case C_LONG:
          la = (long *) ptr;
          la += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            *la = ((long *) buf)[i];
            la += ld + 1;
          }
          break;
        case C_FLOAT:
          fa = (float *) ptr;
          fa += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            *fa = ((float *) buf)[i];
            fa += ld + 1;
          }
          break;
        case C_DBL:
          da = (double *) ptr;
          da += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            *da = ((double *) buf)[i];
            da += ld + 1;
          }
          break;
        case C_DCPL:
          dca = (DoubleComplex *) ptr;
          dca += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            (*dca).real = (((DoubleComplex *) buf)[i]).real;
            (*dca).imag = (((DoubleComplex *) buf)[i]).imag;
            dca += ld + 1;
          }
          break;

        case C_SCPL:
          fca = (SingleComplex *) ptr;
          fca += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            (*fca).real = (((SingleComplex *) buf)[i]).real;
            (*fca).imag = (((SingleComplex *) buf)[i]).imag;
            fca += ld + 1;
          }
          break;

        default:
          pnga_error("ga_set_diagonal_: wrong data type:", type);
      }

      /*free the memory */
      free (buf);

      /* release access to the data */
      lo[0] = iloA;
      lo[1] = jloA;
      hi[0] = ihiA;
      hi[1] = jhiA;
      pnga_release_update (g_a, lo, hi);
    }
  }
}